

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  scoped_padder *this_00;
  size_t sVar1;
  tm *in_RDX;
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff78;
  undefined1 *puVar2;
  buffer<char> *in_stack_ffffffffffffff80;
  memory_buf_t *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff93;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  memory_buf_t *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  
  scoped_padder::scoped_padder
            ((scoped_padder *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
             (padding_info *)
             CONCAT44(in_stack_ffffffffffffff94,
                      CONCAT13(in_stack_ffffffffffffff93,
                               CONCAT12(in_stack_ffffffffffffff92,
                                        CONCAT11(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90
                                                )))),in_stack_ffffffffffffff88);
  to12h(in_RDX);
  fmt_helper::pad2(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  uVar5 = 0x3a;
  ::fmt::v8::detail::buffer<char>::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  fmt_helper::pad2(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  uVar4 = 0x3a;
  ::fmt::v8::detail::buffer<char>::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  fmt_helper::pad2(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  uVar3 = 0x20;
  ::fmt::v8::detail::buffer<char>::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (scoped_padder *)ampm(in_RDX);
  puVar2 = &stack0xffffffffffffff80;
  sVar1 = std::char_traits<char>::length((char_type *)0x155eec);
  *(size_t *)(puVar2 + 8) = sVar1;
  view.size_ = (size_t)in_stack_ffffffffffffffa0;
  view.data_ = in_stack_ffffffffffffff98;
  fmt_helper::append_string_view
            (view,(memory_buf_t *)
                  CONCAT44(in_stack_ffffffffffffff94,
                           CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(uVar3,in_stack_ffffffffffffff90)))
                          ));
  scoped_padder::~scoped_padder(this_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }